

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::IsProvablyOutsideOfLoopBounds
          (LoopDependenceAnalysis *this,Loop *loop,SENode *distance,SENode *coefficient)

{
  int iVar1;
  undefined4 extraout_var;
  SENode *pSVar2;
  SENode *pSVar3;
  long lVar4;
  long *plVar5;
  size_type *psVar6;
  char *pcVar7;
  SENode *operand_2;
  bool bVar8;
  char *pcVar9;
  _Alloc_hider _Var10;
  string *debug_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  iVar1 = (*coefficient->_vptr_SENode[4])(coefficient);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    paVar11 = &local_50.field_2;
    pcVar9 = 
    "IsProvablyOutsideOfLoopBounds could not reduce coefficient to a SEConstantNode so must exit.";
    pcVar7 = "";
    debug_msg = &local_50;
    local_50._M_dataplus._M_p = (pointer)paVar11;
  }
  else {
    pSVar2 = GetLowerBound(this,loop);
    pSVar3 = GetUpperBound(this,loop);
    if (pSVar2 != (SENode *)0x0 && pSVar3 != (SENode *)0x0) {
      if (*(long *)(CONCAT44(extraout_var,iVar1) + 0x30) < 0) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "IsProvablyOutsideOfLoopBounds found coefficient < 0.\nUsing bounds as lower - upper."
                   ,"");
        PrintDebug(this,&local_d0);
        operand_2 = pSVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,
                   "IsProvablyOutsideOfLoopBounds found coefficient >= 0.\nUsing bounds as upper - lower."
                   ,"");
        PrintDebug(this,&local_b0);
        operand_2 = pSVar2;
        pSVar2 = pSVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      pSVar2 = ScalarEvolutionAnalysis::CreateSubtraction(&this->scalar_evolution_,pSVar2,operand_2)
      ;
      pSVar2 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar2);
      pSVar2 = ScalarEvolutionAnalysis::CreateSubtraction(&this->scalar_evolution_,distance,pSVar2);
      pSVar2 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar2);
      iVar1 = (*pSVar2->_vptr_SENode[4])(pSVar2);
      lVar4 = CONCAT44(extraout_var_00,iVar1);
      if (lVar4 == 0) {
        return false;
      }
      ToString<long>(&local_f0,this,*(long *)(lVar4 + 0x30));
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x78ede4);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_110.field_2._M_allocated_capacity = *psVar6;
        local_110.field_2._8_8_ = plVar5[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar6;
        local_110._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_110._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      PrintDebug(this,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)(lVar4 + 0x30) < 1) {
        return false;
      }
      paVar11 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "IsProvablyOutsideOfLoopBounds found distance escaped the loop bounds.","");
      PrintDebug(this,&local_90);
      bVar8 = true;
      _Var10._M_p = local_90._M_dataplus._M_p;
      goto LAB_0060e84b;
    }
    paVar11 = &local_70.field_2;
    pcVar9 = 
    "IsProvablyOutsideOfLoopBounds could not get both the lower and upper bounds so must exit.";
    pcVar7 = "";
    debug_msg = &local_70;
    local_70._M_dataplus._M_p = (pointer)paVar11;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)debug_msg,pcVar9,pcVar7);
  PrintDebug(this,debug_msg);
  _Var10._M_p = (debug_msg->_M_dataplus)._M_p;
  bVar8 = false;
LAB_0060e84b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != paVar11) {
    operator_delete(_Var10._M_p,paVar11->_M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool LoopDependenceAnalysis::IsProvablyOutsideOfLoopBounds(
    const Loop* loop, SENode* distance, SENode* coefficient) {
  // We test to see if we can reduce the coefficient to an integral constant.
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (!coefficient_constant) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds could not reduce coefficient to a "
        "SEConstantNode so must exit.");
    return false;
  }

  SENode* lower_bound = GetLowerBound(loop);
  SENode* upper_bound = GetUpperBound(loop);
  if (!lower_bound || !upper_bound) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds could not get both the lower and upper "
        "bounds so must exit.");
    return false;
  }
  // If the coefficient is positive we calculate bounds as upper - lower
  // If the coefficient is negative we calculate bounds as lower - upper
  SENode* bounds = nullptr;
  if (coefficient_constant->FoldToSingleValue() >= 0) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds found coefficient >= 0.\n"
        "Using bounds as upper - lower.");
    bounds = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.CreateSubtraction(upper_bound, lower_bound));
  } else {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds found coefficient < 0.\n"
        "Using bounds as lower - upper.");
    bounds = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.CreateSubtraction(lower_bound, upper_bound));
  }

  // We can attempt to deal with symbolic cases by subtracting |distance| and
  // the bound nodes. If we can subtract, simplify and produce a SEConstantNode
  // we can produce some information.
  SEConstantNode* distance_minus_bounds =
      scalar_evolution_
          .SimplifyExpression(
              scalar_evolution_.CreateSubtraction(distance, bounds))
          ->AsSEConstantNode();
  if (distance_minus_bounds) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds found distance - bounds as a "
        "SEConstantNode with value " +
        ToString(distance_minus_bounds->FoldToSingleValue()));
    // If distance - bounds > 0 we prove the distance is outwith the loop
    // bounds.
    if (distance_minus_bounds->FoldToSingleValue() > 0) {
      PrintDebug(
          "IsProvablyOutsideOfLoopBounds found distance escaped the loop "
          "bounds.");
      return true;
    }
  }

  return false;
}